

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menuinput.cpp
# Opt level: O2

bool __thiscall DTextEnterMenu::Responder(DTextEnterMenu *this,event_t *ev)

{
  char cVar1;
  BYTE BVar2;
  bool bVar3;
  int iVar4;
  DMenu *pDVar5;
  _func_int **pp_Var6;
  uint uVar7;
  undefined8 uStack_20;
  
  if (ev->type != '\x04') goto LAB_0035b6a7;
  BVar2 = ev->subtype;
  if (BVar2 == '\x04') {
    this->mInputGridOkay = false;
    uVar7 = this->mEnterPos;
    if (this->mEnterSize <= uVar7) {
      return true;
    }
    if (this->mSizeMode != 2) {
      iVar4 = FFont::StringWidth(SmallFont,(BYTE *)this->mEnterString);
      if ((ulong)(this->mEnterSize * 8 - 8) <= (ulong)(long)iVar4) {
        return true;
      }
      uVar7 = this->mEnterPos;
    }
    this->mEnterString[uVar7] = (char)ev->data1;
    uVar7 = this->mEnterPos + 1;
    this->mEnterPos = uVar7;
    this->mEnterString[uVar7] = '\0';
    return true;
  }
  cVar1 = (char)ev->data1;
  if (BVar2 == '\x01') {
    if (cVar1 == '\x1b') {
      pDVar5 = GC::ReadBarrier<DMenu>((DMenu **)&(this->super_DMenu).mParentMenu);
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
      pp_Var6 = (pDVar5->super_DObject)._vptr_DObject;
      uStack_20 = 0xb;
    }
    else {
      if (cVar1 != '\r') {
        if (cVar1 != '\b') {
          return true;
        }
        goto LAB_0035b689;
      }
      if (*this->mEnterString == '\0') {
        return true;
      }
      if (this->AllowColors == true) {
        strbin(this->mEnterString);
      }
      pDVar5 = GC::ReadBarrier<DMenu>((DMenu **)&(this->super_DMenu).mParentMenu);
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])(this);
      pp_Var6 = (pDVar5->super_DObject)._vptr_DObject;
      uStack_20 = 10;
    }
    (*pp_Var6[8])(pDVar5,uStack_20,0);
  }
  else {
    if (cVar1 == '\b' && BVar2 == '\x02') {
LAB_0035b689:
      if (this->mEnterPos != 0) {
        uVar7 = this->mEnterPos - 1;
        this->mEnterPos = uVar7;
        this->mEnterString[uVar7] = '\0';
        BVar2 = ev->subtype;
      }
    }
    if ((byte)(BVar2 - 3) < 0xfe) {
LAB_0035b6a7:
      bVar3 = DMenu::Responder(&this->super_DMenu,ev);
      return bVar3;
    }
  }
  return true;
}

Assistant:

bool DTextEnterMenu::Responder(event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		// Save game and player name string input
		if (ev->subtype == EV_GUI_Char)
		{
			mInputGridOkay = false;
			if (mEnterPos < mEnterSize &&
				(mSizeMode == 2/*entering player name*/ || (size_t)SmallFont->StringWidth(mEnterString) < (mEnterSize-1)*8))
			{
				mEnterString[mEnterPos] = (char)ev->data1;
				mEnterString[++mEnterPos] = 0;
			}
			return true;
		}
		char ch = (char)ev->data1;
		if ((ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat) && ch == '\b')
		{
			if (mEnterPos > 0)
			{
				mEnterPos--;
				mEnterString[mEnterPos] = 0;
			}
		}
		else if (ev->subtype == EV_GUI_KeyDown)
		{
			if (ch == GK_ESCAPE)
			{
				DMenu *parent = mParentMenu;
				Close();
				parent->MenuEvent(MKEY_Abort, false);
				return true;
			}
			else if (ch == '\r')
			{
				if (mEnterString[0])
				{
					// [TP] If we allow color codes, colorize the string now.
					if (AllowColors)
						strbin(mEnterString);

					DMenu *parent = mParentMenu;
					Close();
					parent->MenuEvent(MKEY_Input, false);
					return true;
				}
			}
		}
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			return true;
		}
	}
	return Super::Responder(ev);
}